

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

int __thiscall QCss::ValueExtractor::extractStyleFeatures(ValueExtractor *this)

{
  Declaration *pDVar1;
  int iVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  lVar3 = 0;
  iVar2 = 0;
  for (uVar4 = 0; uVar4 < (ulong)(this->declarations).d.size; uVar4 = uVar4 + 1) {
    pDVar1 = (this->declarations).d.ptr;
    if ((pDVar1[uVar4].d.d.ptr)->propertyId == QtStyleFeatures) {
      iVar2 = Declaration::styleFeaturesValue((Declaration *)((long)&(pDVar1->d).d.ptr + lVar3));
    }
    lVar3 = lVar3 + 8;
  }
  return iVar2;
}

Assistant:

int ValueExtractor::extractStyleFeatures()
{
    int features = StyleFeature_None;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->propertyId == QtStyleFeatures)
            features = decl.styleFeaturesValue();
    }
    return features;
}